

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallRuntimeDependencySetGenerator::GenerateAppleLibraryScript
          (cmInstallRuntimeDependencySetGenerator *this,ostream *os,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *evaluatedRPaths,Indent indent)

{
  cmScriptGeneratorIndent indent_00;
  ostream *poVar1;
  char *permissions_file;
  char *files_var;
  cmAlphaNum local_210;
  cmAlphaNum local_1e0;
  string local_1b0;
  cmAlphaNum local_190;
  cmAlphaNum local_160;
  undefined1 local_130 [8];
  string depNameVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108 [2];
  string local_d8;
  cmAlphaNum local_b8;
  cmAlphaNum local_88;
  undefined1 local_58 [8];
  string depName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *evaluatedRPaths_local;
  string *config_local;
  ostream *os_local;
  cmInstallRuntimeDependencySetGenerator *this_local;
  Indent indent_local;
  
  depName.field_2._12_4_ = indent.Level;
  this_local._4_4_ = indent.Level;
  poVar1 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
  poVar1 = std::operator<<(poVar1,"if(NOT ");
  poVar1 = std::operator<<(poVar1,this->TmpVarPrefix);
  std::operator<<(poVar1,"_dep MATCHES \"\\\\.framework/\")\n");
  cmAlphaNum::cmAlphaNum(&local_88,this->TmpVarPrefix);
  cmAlphaNum::cmAlphaNum(&local_b8,"_dep");
  cmStrCat<>((string *)local_58,&local_88,&local_b8);
  GetDestination(&local_d8,this,config);
  local_108[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_108);
  permissions_file = (char *)std::__cxx11::string::c_str();
  depNameVar.field_2._12_4_ =
       cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
  files_var = (char *)std::__cxx11::string::c_str();
  cmInstallGenerator::AddInstallRule
            (&this->super_cmInstallGenerator,os,&local_d8,cmInstallType_SHARED_LIBRARY,local_108,
             false,permissions_file,(char *)0x0,(char *)0x0," FOLLOW_SYMLINK_CHAIN",
             (Indent)depNameVar.field_2._12_4_,files_var);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_108);
  std::__cxx11::string::~string((string *)&local_d8);
  depNameVar.field_2._8_4_ =
       cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
  poVar1 = ::operator<<(os,(cmScriptGeneratorIndent)depNameVar.field_2._8_4_);
  poVar1 = std::operator<<(poVar1,"get_filename_component(");
  poVar1 = std::operator<<(poVar1,this->TmpVarPrefix);
  poVar1 = std::operator<<(poVar1,"_dep_name \"${");
  poVar1 = std::operator<<(poVar1,this->TmpVarPrefix);
  std::operator<<(poVar1,"_dep}\" NAME)\n");
  cmAlphaNum::cmAlphaNum(&local_160,"${");
  cmAlphaNum::cmAlphaNum(&local_190,this->TmpVarPrefix);
  cmStrCat<char[11]>((string *)local_130,&local_160,&local_190,(char (*) [11])"_dep_name}");
  cmAlphaNum::cmAlphaNum(&local_1e0,"${");
  cmAlphaNum::cmAlphaNum(&local_210,this->TmpVarPrefix);
  cmStrCat<char[6]>(&local_1b0,&local_1e0,&local_210,(char (*) [6])"_dep}");
  indent_00 = cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
  GenerateInstallNameFixup
            (this,os,config,evaluatedRPaths,&local_1b0,(string *)local_130,(Indent)indent_00.Level);
  std::__cxx11::string::~string((string *)&local_1b0);
  poVar1 = ::operator<<(os,(cmScriptGeneratorIndent)this_local._4_4_);
  std::operator<<(poVar1,"endif()\n");
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void cmInstallRuntimeDependencySetGenerator::GenerateAppleLibraryScript(
  std::ostream& os, const std::string& config,
  const std::vector<std::string>& evaluatedRPaths, Indent indent)
{
  os << indent << "if(NOT " << this->TmpVarPrefix
     << "_dep MATCHES \"\\\\.framework/\")\n";

  auto depName = cmStrCat(this->TmpVarPrefix, "_dep");
  this->AddInstallRule(
    os, this->GetDestination(config), cmInstallType_SHARED_LIBRARY, {}, false,
    this->Permissions.c_str(), nullptr, nullptr, " FOLLOW_SYMLINK_CHAIN",
    indent.Next(), depName.c_str());

  os << indent.Next() << "get_filename_component(" << this->TmpVarPrefix
     << "_dep_name \"${" << this->TmpVarPrefix << "_dep}\" NAME)\n";
  auto depNameVar = cmStrCat("${", this->TmpVarPrefix, "_dep_name}");
  this->GenerateInstallNameFixup(os, config, evaluatedRPaths,
                                 cmStrCat("${", this->TmpVarPrefix, "_dep}"),
                                 depNameVar, indent.Next());

  os << indent << "endif()\n";
}